

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::Property
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,
          PropertyIdIndexType propertyIdIndex,bool forceStrictMode)

{
  code *pcVar1;
  PropertyIdIndexType propertyIdIndex_00;
  bool bVar2;
  RegSlot value_00;
  RegSlot instance_00;
  undefined4 *puVar3;
  undefined3 in_register_00000089;
  OpCode op_00;
  RegSlot local_4c;
  RegSlot local_48;
  PropertyIdIndexType local_44;
  undefined4 *local_40;
  PropertyIdIndexType local_38;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000089,forceStrictMode);
  local_38 = propertyIdIndex;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x32);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5e9,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0089f3ec;
    *puVar3 = 0;
  }
  if (value != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0089f3ec;
      *puVar3 = 0;
    }
    value_00 = FunctionBody::MapRegSlot(this->m_functionWrite,value);
    if (instance != 0xffffffff) {
      if (this->m_functionWrite == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar2) goto LAB_0089f3ec;
        *puVar3 = 0;
      }
      instance_00 = FunctionBody::MapRegSlot(this->m_functionWrite,instance);
      if (op < InitClassMemberSet) {
        if (((op - 0x80 < 2) || (op == LdElemUndefScoped)) || (op == StFuncExpr)) goto LAB_0089f2e5;
      }
      else if ((op - 0x118 < 0x40) &&
              ((0x8c00000000400003U >> ((ulong)(op - 0x118) & 0x3f) & 1) != 0)) goto LAB_0089f2e5;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      local_40 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *local_40 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x5fe,"(false)",
                                  "The specified OpCode is not intended for field-access");
      if (bVar2) {
        *local_40 = 0;
LAB_0089f2e5:
        propertyIdIndex_00 = local_38;
        op_00 = op;
        if ((((((this->m_functionWrite->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46
               & 1) == 0 & ((byte)local_34 ^ 1)) == 0) && (op_00 = DeleteFldStrict, op != DeleteFld)
            ) && (op_00 = DeleteRootFldStrict, op != DeleteRootFld)) {
          op_00 = op;
        }
        bVar2 = TryWriteElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,op_00,value_00,instance_00,local_38);
        if ((!bVar2) &&
           (bVar2 = TryWriteElementC<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                              (this,op_00,value_00,instance_00,propertyIdIndex_00), !bVar2)) {
          local_44 = propertyIdIndex_00;
          local_4c = value_00;
          local_48 = instance_00;
          Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op_00,this);
          Data::Write(&this->m_byteCodeData,&local_4c,0xc);
        }
        return;
      }
      goto LAB_0089f3ec;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_0089f3ec:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Property(OpCode op, RegSlot value, RegSlot instance, PropertyIdIndexType propertyIdIndex, bool forceStrictMode)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementC);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        instance = ConsumeReg(instance);

#if DBG
        switch (op)
        {
        case OpCode::InitSetFld:
        case OpCode::InitGetFld:
        case OpCode::InitClassMemberGet:
        case OpCode::InitClassMemberSet:
        case OpCode::InitProto:
        case OpCode::DeleteFld:
        case OpCode::DeleteFld_ReuseLoc:
        case OpCode::DeleteRootFld:
        case OpCode::LdElemUndefScoped:
        case OpCode::StFuncExpr:
            break;

        default:
            AssertMsg(false, "The specified OpCode is not intended for field-access");
            break;
        }
#endif

        if (this->m_functionWrite->GetIsStrictMode() || forceStrictMode)
        {
            if (op == OpCode::DeleteFld)
            {
                op = OpCode::DeleteFldStrict;
            }
            else if (op == OpCode::DeleteRootFld)
            {
                // We will reach here when in the language service mode, since in that mode we have skipped that error.
                op = OpCode::DeleteRootFldStrict;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementC, op, value, instance, propertyIdIndex);
    }